

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTimestamp.cxx
# Opt level: O2

string * __thiscall
cmTimestamp::AddTimestampComponent_abi_cxx11_
          (string *__return_storage_ptr__,cmTimestamp *this,char flag,tm *timeStruct,time_t timeT)

{
  uint uVar1;
  size_t sVar2;
  time_t __time0;
  string *this_00;
  allocator<char> local_209;
  string formatString;
  char buffer [16];
  tm tmUnixEpoch;
  
  this_00 = &formatString;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)this_00,"%",(allocator<char> *)buffer);
  std::__cxx11::string::push_back((char)this_00);
  uVar1 = (int)flag - 0x41;
  if (uVar1 < 0x39) {
    if ((0x140120b01141183U >> ((ulong)uVar1 & 0x3f) & 1) == 0) {
      if ((ulong)uVar1 == 0x32) {
        tmUnixEpoch.tm_sec = 0;
        tmUnixEpoch.tm_min = 0;
        tmUnixEpoch.tm_zone = (char *)0x0;
        tmUnixEpoch.tm_wday = 0;
        tmUnixEpoch.tm_yday = 0;
        tmUnixEpoch.tm_isdst = 0;
        tmUnixEpoch._36_4_ = 0;
        tmUnixEpoch.tm_gmtoff = 0;
        tmUnixEpoch.tm_hour = 0;
        tmUnixEpoch.tm_mday = 1;
        tmUnixEpoch.tm_mon = 0;
        tmUnixEpoch.tm_year = 0x46;
        __time0 = CreateUtcTimeTFromTm((cmTimestamp *)this_00,&tmUnixEpoch);
        if (__time0 == -1) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)buffer,
                     "Error generating UNIX epoch in STRING(TIMESTAMP ...). Please, file a bug report against CMake"
                     ,&local_209);
          cmSystemTools::Error((string *)buffer);
          std::__cxx11::string::~string((string *)buffer);
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          __return_storage_ptr__->_M_string_length = 0;
          (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)buffer);
          difftime(timeT,__time0);
          std::ostream::_M_insert<long>((long)buffer);
          std::__cxx11::stringbuf::str();
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)buffer);
        }
        goto LAB_001c07ab;
      }
      goto LAB_001c084d;
    }
  }
  else {
LAB_001c084d:
    if (flag != 0x25) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)formatString._M_dataplus._M_p == &formatString.field_2) {
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             CONCAT71(formatString.field_2._M_allocated_capacity._1_7_,
                      formatString.field_2._M_local_buf[0]);
        *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = formatString.field_2._8_8_;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = formatString._M_dataplus._M_p;
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             CONCAT71(formatString.field_2._M_allocated_capacity._1_7_,
                      formatString.field_2._M_local_buf[0]);
      }
      __return_storage_ptr__->_M_string_length = formatString._M_string_length;
      formatString._M_string_length = 0;
      formatString.field_2._M_local_buf[0] = '\0';
      formatString._M_dataplus._M_p = (pointer)&formatString.field_2;
      goto LAB_001c07ab;
    }
  }
  sVar2 = strftime(buffer,0x10,formatString._M_dataplus._M_p,(tm *)timeStruct);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,buffer,buffer + sVar2);
LAB_001c07ab:
  std::__cxx11::string::~string((string *)&formatString);
  return __return_storage_ptr__;
}

Assistant:

std::string cmTimestamp::AddTimestampComponent(char flag,
                                               struct tm& timeStruct,
                                               const time_t timeT) const
{
  std::string formatString = "%";
  formatString += flag;

  switch (flag) {
    case 'a':
    case 'A':
    case 'b':
    case 'B':
    case 'd':
    case 'H':
    case 'I':
    case 'j':
    case 'm':
    case 'M':
    case 'S':
    case 'U':
    case 'w':
    case 'y':
    case 'Y':
    case '%':
      break;
    case 's': // Seconds since UNIX epoch (midnight 1-jan-1970)
    {
      // Build a time_t for UNIX epoch and substract from the input "timeT":
      struct tm tmUnixEpoch;
      memset(&tmUnixEpoch, 0, sizeof(tmUnixEpoch));
      tmUnixEpoch.tm_mday = 1;
      tmUnixEpoch.tm_year = 1970 - 1900;

      const time_t unixEpoch = this->CreateUtcTimeTFromTm(tmUnixEpoch);
      if (unixEpoch == -1) {
        cmSystemTools::Error(
          "Error generating UNIX epoch in "
          "STRING(TIMESTAMP ...). Please, file a bug report against CMake");
        return std::string();
      }

      std::ostringstream ss;
      ss << static_cast<long int>(difftime(timeT, unixEpoch));
      return ss.str();
    }
    default: {
      return formatString;
    }
  }

  char buffer[16];

  size_t size =
    strftime(buffer, sizeof(buffer), formatString.c_str(), &timeStruct);

  return std::string(buffer, size);
}